

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O2

bool __thiscall mcsFile::VerifySector(mcsFile *this,uchar *data,unsigned_long len)

{
  ostream *poVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = 0x10000;
  if (len < 0x10000) {
    uVar4 = len;
  }
  uVar3 = 0;
  iVar2 = 0;
  do {
    if (uVar4 == uVar3) {
      bVar5 = iVar2 == 0;
      uVar3 = uVar4 & 0xffffffff;
LAB_00108334:
      return (bool)((int)uVar3 == (int)uVar4 & bVar5);
    }
    if (this->curSector[uVar3] != data[uVar3]) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar1 = std::operator<<((ostream *)&std::cout,"Mismatch at address ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,", file = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,", prom = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      if (8 < iVar2) {
        bVar5 = false;
        goto LAB_00108334;
      }
      iVar2 = iVar2 + 1;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool mcsFile::VerifySector(const unsigned char *data, unsigned long len) const
{
    unsigned int lim = (len < sizeof(curSector)) ? len : sizeof(curSector);
    int num = 0;  // number of mismatches
    unsigned int i;
    for (i = 0; i < lim; i++) {
        if (curSector[i] != data[i]) {
            std::cout << std::hex << "Mismatch at address " << startAddr+i
                      << ", file = " << (unsigned int)curSector[i]
                      << ", prom = " << (unsigned int)data[i] << std::endl;
            if (++num >= 10)
                break;
        }
    }
    return (i == lim) && (num == 0);
}